

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

int nni_file_walk(char *name,nni_file_walker walker,void *arg,int flags)

{
  int iVar1;
  nni_file_walker local_18;
  walkdata w;
  
  local_18 = walker;
  w.fn = (nni_file_walker)arg;
  iVar1 = nni_plat_file_walk(name,plat_walker,&local_18,flags & 6);
  return iVar1;
}

Assistant:

int
nni_file_walk(const char *name, nni_file_walker walker, void *arg, int flags)
{
	struct walkdata w;
	int             wflags = 0;

	w.fn  = walker;
	w.arg = arg;

	if (flags & NNI_FILE_WALK_FILES_ONLY) {
		wflags |= NNI_PLAT_FILE_WALK_FILES_ONLY;
	}
	if (flags & NNI_FILE_WALK_SHALLOW) {
		wflags |= NNI_PLAT_FILE_WALK_SHALLOW;
	}

	return (nni_plat_file_walk(name, plat_walker, &w, wflags));
}